

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O0

int psa_generic_status_to_mbedtls(psa_status_t status)

{
  int local_c;
  psa_status_t status_local;
  
  if (status == -0x97) {
    local_c = -0x6e;
  }
  else if ((status == -0x93) || (status == -0x91)) {
    local_c = -0x70;
  }
  else if (status == -0x86) {
    local_c = -0x72;
  }
  else if ((status == -0x85) || (status != 0)) {
    local_c = -1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int psa_generic_status_to_mbedtls(psa_status_t status)
{
    switch (status) {
        case PSA_SUCCESS:
            return 0;
        case PSA_ERROR_NOT_SUPPORTED:
            return MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED;
        case PSA_ERROR_CORRUPTION_DETECTED:
            return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        case PSA_ERROR_COMMUNICATION_FAILURE:
        case PSA_ERROR_HARDWARE_FAILURE:
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        case PSA_ERROR_NOT_PERMITTED:
        default:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
    }
}